

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cgltf_write.h
# Opt level: O0

void cgltf_write_floatprop(cgltf_write_context *context,char *label,float val,float def)

{
  int iVar1;
  char *pcVar2;
  char *decimal_comma;
  float def_local;
  float val_local;
  char *label_local;
  cgltf_write_context *context_local;
  
  if ((val != def) || (NAN(val) || NAN(def))) {
    cgltf_write_indent(context);
    iVar1 = snprintf(context->cursor,context->remaining,"\"%s\": ",label);
    context->tmp = (long)iVar1;
    context->chars_written = context->tmp + context->chars_written;
    if (context->cursor != (char *)0x0) {
      context->cursor = context->cursor + context->tmp;
      context->remaining = context->remaining - context->tmp;
    }
    iVar1 = snprintf(context->cursor,context->remaining,"%.*g",(double)val,9);
    context->tmp = (long)iVar1;
    context->chars_written = context->tmp + context->chars_written;
    if (context->cursor != (char *)0x0) {
      context->cursor = context->cursor + context->tmp;
      context->remaining = context->remaining - context->tmp;
    }
    context->needs_comma = 1;
    if ((context->cursor != (char *)0x0) &&
       (pcVar2 = strchr(context->cursor + -context->tmp,0x2c), pcVar2 != (char *)0x0)) {
      *pcVar2 = '.';
    }
  }
  return;
}

Assistant:

static void cgltf_write_floatprop(cgltf_write_context* context, const char* label, float val, float def)
{
	if (val != def)
	{
		cgltf_write_indent(context);
		CGLTF_SPRINTF("\"%s\": ", label);
		CGLTF_SPRINTF("%.*g", CGLTF_DECIMAL_DIG, val);
		context->needs_comma = 1;

		if (context->cursor)
		{
			char *decimal_comma = strchr(context->cursor - context->tmp, ',');
			if (decimal_comma)
			{
				*decimal_comma = '.';
			}
		}
	}
}